

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O3

bool __thiscall CCoinsViewCache::GetCoin(CCoinsViewCache *this,COutPoint *outpoint,Coin *coin)

{
  long lVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = FetchCoin(this,outpoint);
  if (iVar2.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>._M_cur ==
      (__node_type *)0x0) {
    bVar3 = false;
  }
  else {
    (coin->out).nValue =
         *(CAmount *)
          ((long)iVar2.
                 super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                 _M_cur + 0x48);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(coin->out).scriptPubKey.super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)iVar2.
                      super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                      ._M_cur + 0x50));
    *(undefined4 *)&coin->field_0x28 =
         *(undefined4 *)
          ((long)iVar2.
                 super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                 _M_cur + 0x70);
    bVar3 = (coin->out).nValue != -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewCache::GetCoin(const COutPoint &outpoint, Coin &coin) const {
    CCoinsMap::const_iterator it = FetchCoin(outpoint);
    if (it != cacheCoins.end()) {
        coin = it->second.coin;
        return !coin.IsSpent();
    }
    return false;
}